

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::ternary_idx(Internal *this,int idx,int64_t *steps,int64_t *htrs)

{
  int iVar1;
  pointer pvVar2;
  uint uVar3;
  pointer pFVar4;
  Flags FVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  
  uVar6 = -idx;
  uVar3 = idx;
  if (idx < 1) {
    uVar3 = uVar6;
  }
  pFVar4 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>._M_impl.
           super__Vector_impl_data._M_start;
  FVar5 = pFVar4[uVar3];
  if (((uint)FVar5 & 0x7000400) == 0x1000400) {
    uVar7 = uVar3 << 1 | (uint)idx >> 0x1f;
    pvVar2 = (this->otab).
             super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = (this->opts).ternaryocclim;
    iVar8 = (int)((ulong)((long)*(pointer *)
                                 ((long)&pvVar2[uVar7].
                                         super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                         *(long *)&pvVar2[uVar7].
                                   super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                   ._M_impl.super__Vector_impl_data) >> 3);
    if ((iVar8 <= iVar1) &&
       (uVar7 = uVar3 << 1 | uVar6 >> 0x1f,
       iVar9 = (int)((ulong)((long)*(pointer *)
                                    ((long)&pvVar2[uVar7].
                                            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                            *(long *)&pvVar2[uVar7].
                                      super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                      ._M_impl.super__Vector_impl_data) >> 3), iVar9 <= iVar1)) {
      if (iVar9 < iVar8) {
        idx = uVar6;
      }
      ternary_lit(this,idx,steps,htrs);
      pFVar4 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
               _M_impl.super__Vector_impl_data._M_start;
      FVar5 = pFVar4[uVar3];
    }
    pFVar4[uVar3] = (Flags)((uint)FVar5 & 0xfffffbff);
  }
  return;
}

Assistant:

void Internal::ternary_idx (int idx, int64_t &steps, int64_t &htrs) {
  assert (0 < idx);
  assert (idx <= max_var);
  if (!active (idx))
    return;
  if (!flags (idx).ternary)
    return;
  int pos = occs (idx).size ();
  int neg = occs (-idx).size ();
  if (pos <= opts.ternaryocclim && neg <= opts.ternaryocclim) {
    LOG ("index %d has %zd positive and %zd negative occurrences", idx,
         occs (idx).size (), occs (-idx).size ());
    int pivot = (neg < pos ? -idx : idx);
    ternary_lit (pivot, steps, htrs);
  }
  flags (idx).ternary = false;
}